

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

bool __thiscall
crnlib::static_huffman_data_model::prepare_decoder_tables(static_huffman_data_model *this)

{
  uint uVar1;
  uint num_syms;
  unsigned_short *p;
  bool bVar2;
  int iVar3;
  decoder_tables *pTables;
  uint uVar4;
  
  uVar1 = (this->m_code_sizes).m_size;
  this->m_encoding = false;
  this->m_total_syms = uVar1;
  p = (this->m_codes).m_p;
  if (p != (unsigned_short *)0x0) {
    crnlib_free(p);
    (this->m_codes).m_p = (unsigned_short *)0x0;
    (this->m_codes).m_size = 0;
    (this->m_codes).m_capacity = 0;
  }
  pTables = this->m_pDecode_tables;
  if (pTables == (decoder_tables *)0x0) {
    pTables = (decoder_tables *)crnlib_malloc(0xc0);
    pTables->m_table_shift = 0;
    pTables->m_table_max_code = 0;
    pTables->m_decode_start_code_size = 0;
    pTables->m_sorted_symbol_order = (uint16 *)0x0;
    *(undefined8 *)&pTables->m_cur_lookup_size = 0;
    *(undefined8 *)((long)&pTables->m_lookup + 4) = 0;
    this->m_pDecode_tables = pTables;
  }
  num_syms = this->m_total_syms;
  uVar4 = 0;
  if (0x10 < num_syms) {
    iVar3 = 0;
    uVar4 = num_syms;
    do {
      iVar3 = iVar3 + -1;
      bVar2 = 3 < uVar4;
      uVar4 = uVar4 >> 1;
    } while (bVar2);
    uVar4 = (((uint)(2 << (~(byte)iVar3 & 0x1f)) < num_syms) + 1) - iVar3;
    if (10 < uVar4) {
      uVar4 = 0xb;
    }
    if (iVar3 == -0x20) {
      uVar4 = 0xb;
    }
  }
  bVar2 = prefix_coding::generate_decoder_tables(num_syms,(this->m_code_sizes).m_p,pTables,uVar4);
  return bVar2;
}

Assistant:

bool static_huffman_data_model::prepare_decoder_tables()
    {
        uint total_syms = m_code_sizes.size();

        CRNLIB_ASSERT((total_syms >= 1) && (total_syms <= prefix_coding::cMaxSupportedSyms));

        m_encoding = false;

        m_total_syms = total_syms;

        m_codes.clear();

        if (!m_pDecode_tables)
        {
            m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>();
        }

        return prefix_coding::generate_decoder_tables(m_total_syms, &m_code_sizes[0], m_pDecode_tables, compute_decoder_table_bits());
    }